

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall embree::Camera::Camera(Camera *this)

{
  Camera *this_local;
  
  *(undefined8 *)&(this->from).field_0 = 0x38d1b71738d1b717;
  *(undefined8 *)((long)&(this->from).field_0 + 8) = 0xc0400000;
  *(undefined8 *)&(this->to).field_0 = 0;
  *(undefined8 *)((long)&(this->to).field_0 + 8) = 0;
  *(undefined8 *)&(this->up).field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->up).field_0 + 8) = 0;
  this->fov = 90.0;
  this->handedness = RIGHT_HANDED;
  return;
}

Assistant:

Camera ()
    : from(0.0001f,0.0001f,-3.0f), to(0,0,0), up(0,1,0), fov(90), handedness(RIGHT_HANDED) {}